

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::Resize(InnerMap *this,size_t new_num_buckets)

{
  ulong uVar1;
  void **table;
  void *pvVar2;
  LogMessage *other;
  void **ppvVar3;
  size_type index;
  LogFinisher local_61;
  LogMessage local_60;
  ulong uVar4;
  
  if (new_num_buckets < 8) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x2ec);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (new_num_buckets) >= (kMinTableSize): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  uVar1 = this->num_buckets_;
  table = this->table_;
  this->num_buckets_ = new_num_buckets;
  ppvVar3 = CreateEmptyTable(this,new_num_buckets);
  this->table_ = ppvVar3;
  index = this->index_of_first_non_null_;
  this->index_of_first_non_null_ = this->num_buckets_;
  while (index < uVar1) {
    pvVar2 = table[index];
    uVar4 = index;
    if (pvVar2 != (void *)0x0) {
      if (pvVar2 == table[index ^ 1]) {
        if ((pvVar2 != (void *)0x0) && (pvVar2 == table[index ^ 1])) {
          uVar4 = index + 1;
          TransferTree(this,table,index);
        }
      }
      else {
        TransferList(this,table,index);
      }
    }
    index = uVar4 + 1;
  }
  if ((this->alloc_).arena_ == (Arena *)0x0) {
    operator_delete(table,uVar1 << 3);
  }
  return;
}

Assistant:

void Resize(size_t new_num_buckets) {
      GOOGLE_DCHECK_GE(new_num_buckets, kMinTableSize);
      void** const old_table = table_;
      const size_type old_table_size = num_buckets_;
      num_buckets_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      const size_type start = index_of_first_non_null_;
      index_of_first_non_null_ = num_buckets_;
      for (size_type i = start; i < old_table_size; i++) {
        if (TableEntryIsNonEmptyList(old_table, i)) {
          TransferList(old_table, i);
        } else if (TableEntryIsTree(old_table, i)) {
          TransferTree(old_table, i++);
        }
      }
      Dealloc<void*>(old_table, old_table_size);
    }